

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.c
# Opt level: O0

char * path2basename(char *path)

{
  char *pcVar1;
  char *local_20;
  char *result;
  char *path_local;
  
  pcVar1 = strrchr(path,0x2f);
  local_20 = path;
  if (pcVar1 != (char *)0x0) {
    local_20 = pcVar1 + 1;
  }
  return local_20;
}

Assistant:

const char *
path2basename(const char *path)
{
    const char *result;

#if defined(_WIN32) || defined(__CYGWIN__)
    result = strrchr(path, '\\');
#else
    result = strrchr(path, '/');
#endif

    return (result == NULL ? path : result + 1);
}